

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

CAmount GetBlockSubsidy(int nHeight,Params *consensusParams)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  CAmount nSubsidy;
  int halvings;
  undefined8 local_10;
  
  iVar1 = in_EDI / *(int *)(in_RSI + 0x20);
  if (iVar1 < 0x40) {
    local_10 = 5000000000 >> ((byte)iVar1 & 0x3f);
  }
  else {
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return local_10;
  }
  __stack_chk_fail(in_EDI,in_RSI,(long)in_EDI % (long)*(int *)(in_RSI + 0x20) & 0xffffffff);
}

Assistant:

CAmount GetBlockSubsidy(int nHeight, const Consensus::Params& consensusParams)
{
    int halvings = nHeight / consensusParams.nSubsidyHalvingInterval;
    // Force block reward to zero when right shift is undefined.
    if (halvings >= 64)
        return 0;

    CAmount nSubsidy = 50 * COIN;
    // Subsidy is cut in half every 210,000 blocks which will occur approximately every 4 years.
    nSubsidy >>= halvings;
    return nSubsidy;
}